

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O1

OptionValue * __thiscall cxxopts::ParseResult::operator[](ParseResult *this,string *option)

{
  iterator iVar1;
  __node_base_ptr p_Var2;
  option_not_present_exception *this_00;
  
  iVar1 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&((this->m_options).
                   super___shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->_M_h,option);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
      ._M_cur != (__node_type *)0x0) {
    p_Var2 = std::
             _Hashtable<std::shared_ptr<cxxopts::OptionDetails>,_std::pair<const_std::shared_ptr<cxxopts::OptionDetails>,_cxxopts::OptionValue>,_std::allocator<std::pair<const_std::shared_ptr<cxxopts::OptionDetails>,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<std::shared_ptr<cxxopts::OptionDetails>_>,_std::hash<std::shared_ptr<cxxopts::OptionDetails>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::_M_find_before_node
                       (&(this->m_results)._M_h,
                        *(ulong *)((long)iVar1.
                                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
                                         ._M_cur + 0x28) % (this->m_results)._M_h._M_bucket_count,
                        (key_type *)
                        ((long)iVar1.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
                               ._M_cur + 0x28),
                        *(ulong *)((long)iVar1.
                                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
                                         ._M_cur + 0x28));
    return (OptionValue *)(p_Var2->_M_nxt + 3);
  }
  this_00 = (option_not_present_exception *)__cxa_allocate_exception(0x28);
  option_not_present_exception::option_not_present_exception(this_00,option);
  __cxa_throw(this_00,&option_not_present_exception::typeinfo,OptionException::~OptionException);
}

Assistant:

const OptionValue &operator[](const std::string &option) const {
    auto iter = m_options->find(option);

    if (iter == m_options->end()) {
      throw option_not_present_exception(option);
    }

    auto riter = m_results.find(iter->second);

    return riter->second;
  }